

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

double Open_JTalk_get_speed(Open_JTalk *open_jtalk,_Bool *error)

{
  _Bool *error_local;
  Open_JTalk *open_jtalk_local;
  double local_8;
  
  if (error != (_Bool *)0x0) {
    *error = false;
  }
  if (open_jtalk == (Open_JTalk *)0x0) {
    if (error != (_Bool *)0x0) {
      *error = true;
    }
    local_8 = 0.0;
  }
  else {
    local_8 = (open_jtalk->engine).condition.speed;
  }
  return local_8;
}

Assistant:

double Open_JTalk_get_speed(Open_JTalk *open_jtalk, bool *error)
{
	if (error)
	{
		*error = false;
	}

	if (open_jtalk == NULL)
	{
		if (error)
		{
			*error = true;
		}
		return 0;
	}
	return open_jtalk->engine.condition.speed;
}